

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O3

bid_t sb_alloc_block(filemgr *file)

{
  ulong uVar1;
  avl_tree *tree;
  uint64_t *puVar2;
  superblock *psVar3;
  bool bVar4;
  avl_node *paVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bmp_idx_node query;
  avl_node local_48;
  
  psVar3 = file->sb;
  psVar3->num_alloc = psVar3->num_alloc + 1;
  do {
    if ((psVar3->bmp_size).super___atomic_base<unsigned_long>._M_i == 0) {
      return 0xffffffffffffffff;
    }
    if (psVar3->num_free_blocks != 0) {
      uVar7 = (psVar3->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i;
      puVar2 = &psVar3->num_free_blocks;
      *puVar2 = *puVar2 - 1;
      if (*puVar2 == 0) goto LAB_00135f20;
      paVar5 = (avl_node *)(uVar7 >> 8);
      uVar6 = (uVar7 & 0xff) + 1;
      tree = &psVar3->bmp_idx;
      goto LAB_00135e70;
    }
  } while ((psVar3->rsv_bmp != (sb_rsv_bmp *)0x0) &&
          (bVar4 = sb_switch_reserved_blocks(file), bVar4));
  uVar7 = 0xffffffffffffffff;
LAB_00135e21:
  LOCK();
  (psVar3->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i = 0xffffffffffffffff;
  UNLOCK();
  return uVar7;
LAB_00135e70:
  if (uVar6 < 0x100) {
    do {
      lVar8 = (uVar6 >> 3) + (long)paVar5 * 0x20;
      uVar9 = (ulong)((uint)uVar6 & 7);
      uVar1 = uVar9 + lVar8 * 8;
      if ((psVar3->bmp_size).super___atomic_base<unsigned_long>._M_i <= uVar1) break;
      if (((psVar3->bmp)._M_b._M_p[lVar8] & bmp_basic_mask[uVar9]) != 0) {
        LOCK();
        (psVar3->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i = uVar1;
        UNLOCK();
        return uVar7;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x100);
  }
  paVar5 = avl_search(tree,&local_48,_bmp_idx_cmp);
  if (paVar5 != (avl_node *)0x0) {
    avl_remove(tree,paVar5);
    free(&paVar5[-1].right);
  }
  paVar5 = avl_first(tree);
  if (paVar5 == (avl_node *)0x0) goto LAB_00135f14;
  paVar5 = paVar5[-1].right;
  uVar6 = 0;
  goto LAB_00135e70;
LAB_00135f14:
  psVar3->num_free_blocks = 0;
LAB_00135f20:
  if ((psVar3->rsv_bmp != (sb_rsv_bmp *)0x0) && (bVar4 = sb_switch_reserved_blocks(file), bVar4)) {
    return uVar7;
  }
  goto LAB_00135e21;
}

Assistant:

bid_t sb_alloc_block(struct filemgr *file)
{
    uint64_t i, node_idx, node_off, bmp_idx, bmp_off;
    bid_t ret = BLK_NOT_FOUND;
    struct superblock *sb = file->sb;
    struct avl_node *a;
    struct bmp_idx_node *item, query;

    sb->num_alloc++;
sb_alloc_start_over:
    if (!sb_bmp_exists(sb)) {
        // no bitmap
        return BLK_NOT_FOUND;
    }

    if (sb->num_free_blocks == 0) {
        bool switched = false;
        if (sb->rsv_bmp) {
            switched = sb_switch_reserved_blocks(file);
        }
        if (switched) {
            goto sb_alloc_start_over;
        } else {
            atomic_store_uint64_t(&sb->cur_alloc_bid, BLK_NOT_FOUND);
            return BLK_NOT_FOUND;
        }
    }

    ret = atomic_get_uint64_t(&sb->cur_alloc_bid);
    sb->num_free_blocks--;

    if (sb->num_free_blocks == 0) {
        bool switched = false;
        if (sb->rsv_bmp) {
            switched = sb_switch_reserved_blocks(file);
        }
        if (!switched) {
            atomic_store_uint64_t(&sb->cur_alloc_bid, BLK_NOT_FOUND);
        }
        return ret;
    }

    // find allocable block in the same bmp idx node
    node_idx = ret >> 8;
    node_off = (ret & 0xff)+1;
    do {
        for (i=node_off; i<256; ++i) {
            bmp_idx = div8(i) + (node_idx * 32);
            bmp_off = mod8(i);

            if (bmp_idx*8 + bmp_off >= atomic_get_uint64_t(&sb->bmp_size)) {
                break;
            }

            if (sb->bmp[bmp_idx] & bmp_basic_mask[bmp_off]) {
                atomic_store_uint64_t(&sb->cur_alloc_bid, bmp_idx*8 + bmp_off);
                return ret;
            }
        }

        // current bmp_node does not include any free block .. remove
        query.id = node_idx;
        a = avl_search(&sb->bmp_idx, &query.avl, _bmp_idx_cmp);
        if (a) {
            item = _get_entry(a, struct bmp_idx_node, avl);
            avl_remove(&sb->bmp_idx, a);
            free(item);
        }

        // get next allocable bmp_node
        a = avl_first(&sb->bmp_idx);
        if (!a) {
            // no more free bmp_node
            sb->num_free_blocks = 0;
            bool switched = false;
            if (sb->rsv_bmp) {
                switched = sb_switch_reserved_blocks(file);
            }
            if (!switched) {
                atomic_store_uint64_t(&sb->cur_alloc_bid, BLK_NOT_FOUND);
            }
            break;
        }
        item = _get_entry(a, struct bmp_idx_node, avl);
        node_idx = item->id;
        node_off = 0;
    } while (true);

    return ret;
}